

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIPNode * PVIP_node_new_children(PVIPParserContext *parser,PVIP_node_type_t type)

{
  PVIPNode *__s;
  PVIPNode *node;
  PVIP_node_type_t type_local;
  PVIPParserContext *parser_local;
  
  __s = pvip_node_alloc(parser->pvip);
  memset(__s,0,0x18);
  if (type == PVIP_NODE_NUMBER) {
    __assert_fail("type != PVIP_NODE_NUMBER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,200,"PVIPNode *PVIP_node_new_children(PVIPParserContext *, PVIP_node_type_t)");
  }
  if (type != PVIP_NODE_INT) {
    __s->type = type;
    (__s->field_2).children.size = 0;
    (__s->field_2).children.nodes = (_PVIPNode **)0x0;
    if (parser->line_number_stack_size == 0) {
      __s->line_number = parser->line_number;
    }
    else {
      __s->line_number = parser->line_number_stack[parser->line_number_stack_size - 1];
    }
    return __s;
  }
  __assert_fail("type != PVIP_NODE_INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,0xc9,"PVIPNode *PVIP_node_new_children(PVIPParserContext *, PVIP_node_type_t)");
}

Assistant:

PVIPNode* PVIP_node_new_children(PVIPParserContext *parser, PVIP_node_type_t type) {
    PVIPNode *node = pvip_node_alloc(parser->pvip);
    memset(node, 0, sizeof(PVIPNode));
    assert(type != PVIP_NODE_NUMBER);
    assert(type != PVIP_NODE_INT);
    node->type = type;
    node->children.size  = 0;
    node->children.nodes = NULL;
    if (parser->line_number_stack_size > 0) {
        node->line_number = parser->line_number_stack[parser->line_number_stack_size-1];
    } else {
        node->line_number = parser->line_number;
    }
    return node;
}